

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::make_item_matchcase
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  pointer pcVar1;
  char32_t cVar2;
  pointer pcVar3;
  pointer pCVar4;
  
  if (this->case_sensitive_ == false) {
    pcVar3 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar3 != pcVar1) {
      pCVar4 = (this->props_).
               super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pCVar4->uppercase == true) {
          cVar2 = u_tolower_70(*pcVar3);
          *pcVar3 = cVar2;
        }
        pcVar3 = pcVar3 + 1;
        pCVar4 = pCVar4 + 1;
      } while (pcVar3 != pcVar1);
    }
  }
  return;
}

Assistant:

void make_item_matchcase() {
    if (!case_sensitive_) {
      auto props_it = props_.cbegin();
      for (auto item_it = item_.begin(), item_last = item_.end();
           item_it != item_last; ++item_it, ++props_it) {
        if (props_it->uppercase) {
          *item_it = StringTraits::uppercase_to_lowercase(*item_it);
        }
      }
    }
  }